

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O1

bool CoreML::Specification::vectorsEqual<CoreML::Specification::StringVector>
               (StringVector *a,StringVector *b)

{
  int iVar1;
  Type *pTVar2;
  Type *pTVar3;
  size_type __n;
  bool bVar4;
  int iVar5;
  
  if ((a->vector_).super_RepeatedPtrFieldBase.current_size_ ==
      (b->vector_).super_RepeatedPtrFieldBase.current_size_) {
    iVar5 = (a->vector_).super_RepeatedPtrFieldBase.current_size_;
    bVar4 = iVar5 < 1;
    if (0 < iVar5) {
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(a->vector_).super_RepeatedPtrFieldBase,0);
      pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(b->vector_).super_RepeatedPtrFieldBase,0);
      __n = pTVar2->_M_string_length;
      if (__n == pTVar3->_M_string_length) {
        iVar5 = 1;
        do {
          if ((__n != 0) &&
             (iVar1 = bcmp((pTVar2->_M_dataplus)._M_p,(pTVar3->_M_dataplus)._M_p,__n), iVar1 != 0))
          {
            return bVar4;
          }
          iVar1 = (a->vector_).super_RepeatedPtrFieldBase.current_size_;
          bVar4 = iVar1 <= iVar5;
          if (iVar1 <= iVar5) {
            return bVar4;
          }
          pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&(a->vector_).super_RepeatedPtrFieldBase,iVar5);
          pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&(b->vector_).super_RepeatedPtrFieldBase,iVar5);
          __n = pTVar2->_M_string_length;
          iVar5 = iVar5 + 1;
        } while (__n == pTVar3->_M_string_length);
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool operator!=(const CoreML::Specification::FeatureVectorizer_InputColumn& a,
                        const CoreML::Specification::FeatureVectorizer_InputColumn& b) {
            return !(a == b);
        }